

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

void __thiscall
soplex::
LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::LPColSetBase(LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int pmax,int pmemmax)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  DataArray<int> *in_RDI;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *unaff_retaddr;
  pointer *p_fac;
  undefined8 in_stack_ffffffffffffffc8;
  int p_dimen;
  pointer *ppnVar1;
  double in_stack_ffffffffffffffe8;
  
  p_dimen = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SVSetBase(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(double)CONCAT44(in_ESI,in_EDX)
              ,in_stack_ffffffffffffffe8);
  *(undefined ***)in_RDI = &PTR__LPColSetBase_0089f7b8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_RDI,p_dimen);
  ppnVar1 = (pointer *)&in_RDI[5].data;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_RDI,(int)((ulong)ppnVar1 >> 0x20));
  p_fac = (pointer *)&in_RDI[6].data;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_RDI,(int)((ulong)ppnVar1 >> 0x20));
  DataArray<int>::DataArray(in_RDI,(int)((ulong)ppnVar1 >> 0x20),(int)ppnVar1,(Real)p_fac);
  return;
}

Assistant:

explicit
   LPColSetBase(int pmax = -1, int pmemmax = -1)
      : SVSetBase<R>(pmax, pmemmax), low(0), up(0), object(0), scaleExp(0)
   {
      assert(isConsistent());
   }